

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void string_process_escapes(string *input)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  pointer pcVar5;
  ulong uVar6;
  long lVar7;
  char x [3];
  char *err_p;
  char local_3b;
  char local_3a;
  char local_39;
  char *local_38;
  
  uVar3 = input->_M_string_length;
  if (uVar3 == 0) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      pcVar5 = (input->_M_dataplus)._M_p;
      if ((pcVar5[uVar6] == '\\') && (uVar1 = uVar6 + 1, uVar1 < uVar3)) {
        bVar2 = pcVar5[uVar1];
        if (bVar2 < 0x6e) {
          if (bVar2 == 0x22) {
            pcVar5[lVar7] = '\"';
          }
          else if (bVar2 == 0x27) {
            pcVar5[lVar7] = '\'';
          }
          else {
            if (bVar2 != 0x5c) goto LAB_001f73e0;
            pcVar5[lVar7] = '\\';
          }
        }
        else if (bVar2 < 0x74) {
          if (bVar2 == 0x6e) {
            pcVar5[lVar7] = '\n';
          }
          else {
            if (bVar2 != 0x72) goto LAB_001f73e0;
            pcVar5[lVar7] = '\r';
          }
        }
        else {
          if (bVar2 != 0x74) {
            if ((bVar2 == 0x78) && (uVar6 + 3 < uVar3)) {
              local_3b = pcVar5[uVar6 + 2];
              local_3a = pcVar5[uVar6 + 3];
              local_39 = '\0';
              local_38 = (char *)0x0;
              lVar4 = strtol(&local_3b,&local_38,0x10);
              if (local_38 == &local_39) {
                (input->_M_dataplus)._M_p[lVar7] = (char)lVar4;
                lVar7 = lVar7 + 1;
                uVar6 = uVar6 + 3;
                goto LAB_001f7360;
              }
              pcVar5 = (input->_M_dataplus)._M_p;
            }
LAB_001f73e0:
            pcVar5[lVar7] = '\\';
            pcVar5 = (input->_M_dataplus)._M_p;
            pcVar5[lVar7 + 1] = pcVar5[uVar1];
            lVar7 = lVar7 + 2;
            uVar6 = uVar1;
            goto LAB_001f7360;
          }
          pcVar5[lVar7] = '\t';
        }
        lVar7 = lVar7 + 1;
        uVar6 = uVar1;
      }
      else {
        pcVar5[lVar7] = pcVar5[uVar6];
        lVar7 = lVar7 + 1;
      }
LAB_001f7360:
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar3);
  }
  std::__cxx11::string::resize((ulong)input,(char)lVar7);
  return;
}

Assistant:

void string_process_escapes(std::string & input) {
    std::size_t input_len = input.length();
    std::size_t output_idx = 0;

    for (std::size_t input_idx = 0; input_idx < input_len; ++input_idx) {
        if (input[input_idx] == '\\' && input_idx + 1 < input_len) {
            switch (input[++input_idx]) {
                case 'n':  input[output_idx++] = '\n'; break;
                case 'r':  input[output_idx++] = '\r'; break;
                case 't':  input[output_idx++] = '\t'; break;
                case '\'': input[output_idx++] = '\''; break;
                case '\"': input[output_idx++] = '\"'; break;
                case '\\': input[output_idx++] = '\\'; break;
                case 'x':
                    // Handle \x12, etc
                    if (input_idx + 2 < input_len) {
                        const char x[3] = { input[input_idx + 1], input[input_idx + 2], 0 };
                        char *err_p = nullptr;
                        const long val = std::strtol(x, &err_p, 16);
                        if (err_p == x + 2) {
                            input_idx += 2;
                            input[output_idx++] = char(val);
                            break;
                        }
                    }
                    // fall through
                default:   input[output_idx++] = '\\';
                           input[output_idx++] = input[input_idx]; break;
            }
        } else {
            input[output_idx++] = input[input_idx];
        }
    }

    input.resize(output_idx);
}